

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b_game.cpp
# Opt level: O3

bool __thiscall FCajunMaster::LoadBots(FCajunMaster *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  botinfo_t *pbVar5;
  char *pcVar6;
  undefined8 extraout_RAX;
  char **front;
  ulong uVar7;
  long lVar8;
  FString tmp;
  char teamstr [16];
  FScanner sc;
  uint local_154;
  FString local_150;
  FString local_148 [2];
  ulong local_138;
  FScanner local_130;
  
  FScanner::FScanner(&local_130);
  local_150.Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  ForgetBots(&bglobal);
  M_GetCajunPath((char *)local_148);
  FString::operator=(&local_150,local_148);
  FString::~FString(local_148);
  if (((FNullStringData *)(local_150.Chars + -0xc))->Len == 0) {
    bVar1 = false;
    DPrintf(1,"No bots.cfg, so no bots\n");
  }
  else {
    FScanner::OpenFile(&local_130,local_150.Chars);
    local_138 = 0;
    local_154 = 0;
    while (bVar1 = FScanner::GetString(&local_130), bVar1) {
      bVar1 = FScanner::Compare(&local_130,"{");
      if (!bVar1) {
        FScanner::ScriptError(&local_130,"Unexpected token \'%s\'\n",local_130.String);
      }
      pbVar5 = (botinfo_t *)operator_new(0x30);
      (pbVar5->skill).reaction = 0;
      (pbVar5->skill).isp = 0;
      pbVar5->inuse = 0;
      pbVar5->lastteam = 0;
      pbVar5->info = (char *)0x0;
      (pbVar5->skill).aiming = 0;
      (pbVar5->skill).perfection = 0;
      pbVar5->next = (botinfo_t *)0x0;
      pbVar5->name = (char *)0x0;
      pcVar6 = copystring("\\autoaim\\0\\movebob\\.25");
      front = &pbVar5->info;
      pbVar5->info = pcVar6;
      bVar1 = false;
      while( true ) {
        FScanner::MustGetString(&local_130);
        bVar2 = FScanner::Compare(&local_130,"}");
        if (bVar2) break;
        iVar3 = FScanner::MatchString(&local_130,BotConfigStrings,8);
        pcVar6 = local_130.String;
        switch(iVar3) {
        case 0:
          FScanner::MustGetString(&local_130);
          appendinfo(front,"name");
          appendinfo(front,local_130.String);
          pcVar6 = copystring(local_130.String);
          pbVar5->name = pcVar6;
          break;
        case 1:
          FScanner::MustGetNumber(&local_130);
          (pbVar5->skill).aiming = local_130.Number;
          break;
        case 2:
          FScanner::MustGetNumber(&local_130);
          (pbVar5->skill).perfection = local_130.Number;
          break;
        case 3:
          FScanner::MustGetNumber(&local_130);
          (pbVar5->skill).reaction = local_130.Number;
          break;
        case 4:
          FScanner::MustGetNumber(&local_130);
          (pbVar5->skill).isp = local_130.Number;
          break;
        case 5:
          FScanner::MustGetString(&local_130);
          bVar2 = IsNum(local_130.String);
          if (bVar2) {
            uVar4 = atoi(local_130.String);
            bVar2 = FTeam::IsValidTeam(&TeamLibrary,uVar4 & 0xff);
            if (!bVar2) {
              uVar4 = 0xff;
            }
            uVar7 = (ulong)uVar4;
          }
          else {
            uVar7 = 0xff;
            if (Teams.Count != 0) {
              lVar8 = 0;
              uVar7 = 0;
              do {
                pcVar6 = FTeam::GetName((FTeam *)((long)&(Teams.Array)->m_iPlayerCount + lVar8));
                iVar3 = strcasecmp(pcVar6,local_130.String);
                if (iVar3 == 0) {
                  uVar7 = uVar7 & 0xffffffff;
                  goto LAB_0049e402;
                }
                uVar7 = uVar7 + 1;
                lVar8 = lVar8 + 0x38;
              } while (uVar7 < Teams.Count);
              uVar7 = 0xff;
            }
          }
LAB_0049e402:
          appendinfo(front,"team");
          mysnprintf((char *)local_148,0x10,"%d",uVar7 & 0xff);
          appendinfo(front,(char *)local_148);
          local_138 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
          break;
        default:
          iVar3 = strcasecmp(local_130.String,"playerclass");
          appendinfo(front,pcVar6);
          FScanner::MustGetString(&local_130);
          bVar1 = (bool)(bVar1 | iVar3 == 0);
          appendinfo(front,local_130.String);
        }
      }
      if (!bVar1) {
        appendinfo(front,"playerclass");
        appendinfo(front,"random");
      }
      if ((local_138 & 1) == 0) {
        appendinfo(front,"team");
        appendinfo(front,"255");
      }
      pbVar5->next = bglobal.botinfo;
      pbVar5->lastteam = 0xff;
      local_154 = local_154 + 1;
      bglobal.botinfo = pbVar5;
    }
    bVar1 = true;
    Printf("%d bots read from %s\n",(ulong)local_154,"bots.cfg");
  }
  FString::~FString(&local_150);
  FScanner::~FScanner(&local_130);
  return bVar1;
}

Assistant:

bool FCajunMaster::LoadBots ()
{
	FScanner sc;
	FString tmp;
	bool gotteam = false;
	int loaded_bots = 0;

	bglobal.ForgetBots ();
	tmp = M_GetCajunPath(BOTFILENAME);
	if (tmp.IsEmpty())
	{
		DPrintf (DMSG_ERROR, "No " BOTFILENAME ", so no bots\n");
		return false;
	}
	try
	{
		sc.OpenFile(tmp);
	}
	catch (CRecoverableError &err)
	{
		Printf("%s. So no bots\n", err.GetMessage());
		return false;
	}

	while (sc.GetString ())
	{
		if (!sc.Compare ("{"))
		{
			sc.ScriptError ("Unexpected token '%s'\n", sc.String);
		}

		botinfo_t *newinfo = new botinfo_t;
		bool gotclass = false;

		memset (newinfo, 0, sizeof(*newinfo));

		newinfo->info = copystring ("\\autoaim\\0\\movebob\\.25");

		for (;;)
		{
			sc.MustGetString ();
			if (sc.Compare ("}"))
				break;

			switch (sc.MatchString (BotConfigStrings))
			{
			case BOTCFG_NAME:
				sc.MustGetString ();
				appendinfo (newinfo->info, "name");
				appendinfo (newinfo->info, sc.String);
				newinfo->name = copystring (sc.String);
				break;

			case BOTCFG_AIMING:
				sc.MustGetNumber ();
				newinfo->skill.aiming = sc.Number;
				break;

			case BOTCFG_PERFECTION:
				sc.MustGetNumber ();
				newinfo->skill.perfection = sc.Number;
				break;

			case BOTCFG_REACTION:
				sc.MustGetNumber ();
				newinfo->skill.reaction = sc.Number;
				break;

			case BOTCFG_ISP:
				sc.MustGetNumber ();
				newinfo->skill.isp = sc.Number;
				break;

			case BOTCFG_TEAM:
				{
					char teamstr[16];
					BYTE teamnum;

					sc.MustGetString ();
					if (IsNum (sc.String))
					{
						teamnum = atoi (sc.String);
						if (!TeamLibrary.IsValidTeam (teamnum))
						{
							teamnum = TEAM_NONE;
						}
					}
					else
					{
						teamnum = TEAM_NONE;
						for (unsigned int i = 0; i < Teams.Size(); ++i)
						{
							if (stricmp (Teams[i].GetName (), sc.String) == 0)
							{
								teamnum = i;
								break;
							}
						}
					}
					appendinfo (newinfo->info, "team");
					mysnprintf (teamstr, countof(teamstr), "%d", teamnum);
					appendinfo (newinfo->info, teamstr);
					gotteam = true;
					break;
				}

			default:
				if (stricmp (sc.String, "playerclass") == 0)
				{
					gotclass = true;
				}
				appendinfo (newinfo->info, sc.String);
				sc.MustGetString ();
				appendinfo (newinfo->info, sc.String);
				break;
			}
		}
		if (!gotclass)
		{ // Bots that don't specify a class get a random one
			appendinfo (newinfo->info, "playerclass");
			appendinfo (newinfo->info, "random");
		}
		if (!gotteam)
		{ // Same for bot teams
			appendinfo (newinfo->info, "team");
			appendinfo (newinfo->info, "255");
		}
		newinfo->next = bglobal.botinfo;
		newinfo->lastteam = TEAM_NONE;
		bglobal.botinfo = newinfo;
		loaded_bots++;
	}
	Printf ("%d bots read from %s\n", loaded_bots, BOTFILENAME);
	return true;
}